

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddTargetItem
          (cmComputeLinkInformation *this,string *item,cmTarget *target)

{
  cmTarget *pcVar1;
  bool bVar2;
  iterator iVar3;
  cmTarget *target_local;
  Item local_50;
  
  target_local = target;
  if ((target->TargetTypeValue != STATIC_LIBRARY) &&
     (SetCurrentLinkType(this,LinkShared), target->TargetTypeValue == SHARED_LIBRARY)) {
    std::
    _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
    ::_M_insert_unique<cmTarget_const*const&>
              ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                *)&this->SharedLibrariesLinked,&target_local);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar2 = cmTarget::IsImportedSharedLibWithoutSOName(target_local,&this->Config), bVar2)) {
    AddSharedLibNoSOName(this,item);
    return;
  }
  if ((this->LibLinkFileFlag)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)&this->LibLinkFileFlag);
    local_50.IsPath = false;
    local_50.Target = (cmTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->OldLinkDirMode == true) && (bVar2 = cmTarget::IsFrameworkOnApple(target_local), !bVar2)
     ) {
    cmsys::SystemTools::GetFilenamePath(&local_50.Value,item);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&local_50.Value);
    std::__cxx11::string::~string((string *)&local_50);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,item);
    }
  }
  pcVar1 = target_local;
  std::__cxx11::string::string((string *)&local_50,(string *)item);
  local_50.IsPath = true;
  local_50.Target = pcVar1;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(std::string const& item,
                                             cmTarget const* target)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if(target->GetType() != cmTarget::STATIC_LIBRARY)
    {
    this->SetCurrentLinkType(LinkShared);
    }

  // Keep track of shared library targets linked.
  if(target->GetType() == cmTarget::SHARED_LIBRARY)
    {
    this->SharedLibrariesLinked.insert(target);
    }

  // Handle case of an imported shared library with no soname.
  if(this->NoSONameUsesPath &&
     target->IsImportedSharedLibWithoutSOName(this->Config))
    {
    this->AddSharedLibNoSOName(item);
    return;
    }

  // If this platform wants a flag before the full path, add it.
  if(!this->LibLinkFileFlag.empty())
    {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
    }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if(this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
     this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
     this->OldLinkDirMask.end())
    {
    this->OldLinkDirItems.push_back(item);
    }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true, target));
}